

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

uint32_t xpsr_read(CPUARMState_conflict *env)

{
  return env->GE << 0x10 |
         (env->condexec_bits & 0xfc) << 8 |
         (env->condexec_bits & 3) << 0x19 | env->thumb << 0x18 | env->QF << 0x1b |
         env->VF >> 3 & 0x10000000 |
         env->CF << 0x1d | (uint)(env->ZF == 0) << 0x1e | env->NF & 0x80000000 |
         (env->v7m).exception;
}

Assistant:

static inline uint32_t xpsr_read(CPUARMState *env)
{
    int ZF;
    ZF = (env->ZF == 0);
    return (env->NF & 0x80000000) | (ZF << 30)
        | (env->CF << 29) | ((env->VF & 0x80000000) >> 3) | (env->QF << 27)
        | (env->thumb << 24) | ((env->condexec_bits & 3) << 25)
        | ((env->condexec_bits & 0xfc) << 8)
        | (env->GE << 16)
        | env->v7m.exception;
}